

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

void WebPMuxDelete(WebPMux *mux)

{
  long in_RDI;
  
  if (in_RDI != 0) {
    MuxRelease((WebPMux *)0x1a3565);
    WebPSafeFree((void *)0x1a356e);
  }
  return;
}

Assistant:

void WebPMuxDelete(WebPMux* mux) {
  if (mux != NULL) {
    MuxRelease(mux);
    WebPSafeFree(mux);
  }
}